

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcPartialsPartials
          (BeagleCPUImpl<float,_1,_0> *this,float *destP,float *partials1,float *matrices1,
          float *partials2,float *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  int j;
  float sum2B;
  float sum1B;
  float sum2A;
  float sum1A;
  float *matrices2Ptr;
  float *matrices1Ptr;
  int i;
  int k;
  float *destPtr;
  float *partials2Ptr;
  float *partials1Ptr;
  int matrixOffset;
  int v;
  int l;
  int stateCountModFour;
  int matrixIncr;
  float *matrices2_local;
  float *partials2_local;
  float *matrices1_local;
  
  iVar8 = this->kStateCount + 1;
  iVar1 = this->kStateCount;
  for (partials2Ptr._4_4_ = 0; partials2Ptr._4_4_ < this->kCategoryCount;
      partials2Ptr._4_4_ = partials2Ptr._4_4_ + 1) {
    iVar6 = partials2Ptr._4_4_ * this->kPartialsPaddedStateCount * this->kPatternCount +
            this->kPartialsPaddedStateCount * startPattern;
    iVar7 = partials2Ptr._4_4_ * this->kMatrixSize;
    _i = partials1 + iVar6;
    matrices1Ptr = partials2 + iVar6;
    matrices2Ptr = destP + iVar6;
    for (sum1A = (float)startPattern; (int)sum1A < endPattern; sum1A = (float)((int)sum1A + 1)) {
      for (sum2A = 0.0; (int)sum2A < this->kStateCount; sum2A = (float)((int)sum2A + 1)) {
        lVar9 = (long)((int)sum2A * iVar8);
        lVar10 = (long)((int)sum2A * iVar8);
        local_7c = 0.0;
        local_80 = 0.0;
        local_84 = 0.0;
        local_88 = 0.0;
        for (local_8c = 0; local_8c < iVar1 / 4 << 2; local_8c = local_8c + 4) {
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)_i[local_8c]),
                                   ZEXT416((uint)matrices1[(long)iVar7 + lVar9 + local_8c]),
                                   ZEXT416((uint)local_7c));
          auVar3 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_8c]),
                                   ZEXT416((uint)matrices2[(long)iVar7 + lVar10 + local_8c]),
                                   ZEXT416((uint)local_80));
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)_i[local_8c + 1]),
                                   ZEXT416((uint)matrices1[(long)iVar7 + lVar9 + (local_8c + 1)]),
                                   ZEXT416((uint)local_84));
          auVar5 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_8c + 1]),
                                   ZEXT416((uint)matrices2[(long)iVar7 + lVar10 + (local_8c + 1)]),
                                   ZEXT416((uint)local_88));
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)_i[local_8c + 2]),
                                   ZEXT416((uint)matrices1[(long)iVar7 + lVar9 + (local_8c + 2)]),
                                   ZEXT416(auVar2._0_4_));
          local_7c = auVar2._0_4_;
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_8c + 2]),
                                   ZEXT416((uint)matrices2[(long)iVar7 + lVar10 + (local_8c + 2)]),
                                   ZEXT416(auVar3._0_4_));
          local_80 = auVar2._0_4_;
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)_i[local_8c + 3]),
                                   ZEXT416((uint)matrices1[(long)iVar7 + lVar9 + (local_8c + 3)]),
                                   ZEXT416(auVar4._0_4_));
          local_84 = auVar2._0_4_;
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_8c + 3]),
                                   ZEXT416((uint)matrices2[(long)iVar7 + lVar10 + (local_8c + 3)]),
                                   ZEXT416(auVar5._0_4_));
          local_88 = auVar2._0_4_;
        }
        for (; local_8c < this->kStateCount; local_8c = local_8c + 1) {
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)_i[local_8c]),
                                   ZEXT416((uint)matrices1[(long)iVar7 + lVar9 + local_8c]),
                                   ZEXT416((uint)local_7c));
          local_7c = auVar2._0_4_;
          auVar2 = vfmadd213ss_fma(ZEXT416((uint)matrices1Ptr[local_8c]),
                                   ZEXT416((uint)matrices2[(long)iVar7 + lVar10 + local_8c]),
                                   ZEXT416((uint)local_80));
          local_80 = auVar2._0_4_;
        }
        *matrices2Ptr = (local_7c + local_84) * (local_80 + local_88);
        matrices2Ptr = matrices2Ptr + 1;
      }
      _i = _i + this->kPartialsPaddedStateCount;
      matrices1Ptr = matrices1Ptr + this->kPartialsPaddedStateCount;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartials(REALTYPE* destP,
                                                             const REALTYPE* partials1,
                                                             const REALTYPE* matrices1,
                                                             const REALTYPE* partials2,
                                                             const REALTYPE* matrices2,
                                                             int startPattern,
                                                             int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {

            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B);
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}